

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_persist.cpp
# Opt level: O2

bool node::LoadMempool(CTxMemPool *pool,path *load_path,Chainstate *active_chainstate,
                      ImportMempoolOptions *opts)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  element_type *peVar7;
  uint64_t uVar8;
  bool bVar9;
  int iVar10;
  _IO_FILE *file_00;
  time_point tVar11;
  uint64_t uVar12;
  uint64_t accept_time;
  _Rb_tree_node_base *p_Var13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  undefined8 in_stack_fffffffffffffd90;
  pointer in_stack_fffffffffffffd98;
  long lVar16;
  long local_260;
  long local_258;
  long local_250;
  CAmount amountdelta;
  CTransactionRef tx;
  int percentage_done;
  uint64_t txns_tried;
  uint64_t total_txns_to_load;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_200;
  vector<std::byte,_std::allocator<std::byte>_> xor_key;
  int64_t unbroadcast;
  int64_t already_there;
  int64_t failed;
  int64_t expired;
  int64_t count;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_1a8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  AutoFile file;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> unbroadcast_txids;
  map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> mapDeltas
  ;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((load_path->super_path)._M_pathname._M_string_length == 0) {
    bVar9 = false;
  }
  else {
    file_00 = std::function<_IO_FILE_*(const_fs::path_&,_const_char_*)>::operator()
                        (&opts->mockable_fopen_function,load_path,"rb");
    local_1a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd90;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pool;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffd98;
    AutoFile::AutoFile(&file,file_00,data_xor);
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_1a8);
    if (file.m_file == (FILE *)0x0) {
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
      ;
      source_file_01._M_len = 0x68;
      logging_function_01._M_str = "LoadMempool";
      logging_function_01._M_len = 0xb;
      LogPrintFormatInternal<>
                (logging_function_01,source_file_01,0x2f,ALL,Info,
                 (ConstevalFormatString<0U>)0xcb5e88);
    }
    else {
      count = 0;
      expired = 0;
      failed = 0;
      already_there = 0;
      unbroadcast = 0;
      tVar11 = NodeClock::now();
      uVar12 = ser_readdata64<AutoFile>(&file);
      xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (uVar12 == 1) {
LAB_007a5c98:
        std::vector<std::byte,_std::allocator<std::byte>_>::vector
                  ((vector<std::byte,_std::allocator<std::byte>_> *)&local_200,&xor_key);
        std::vector<std::byte,_std::allocator<std::byte>_>::operator=
                  (&file.m_xor,(vector<std::byte,_std::allocator<std::byte>_> *)&local_200);
        std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_200);
        total_txns_to_load = ser_readdata64<AutoFile>(&file);
        txns_tried = 0;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
        ;
        source_file._M_len = 0x68;
        logging_function._M_str = "LoadMempool";
        logging_function._M_len = 0xb;
        LogPrintFormatInternal<unsigned_long>
                  (logging_function,source_file,0x49,ALL,Info,(ConstevalFormatString<1U>)0xcb5eb9,
                   &total_txns_to_load);
        local_258 = 0;
        local_260 = 0;
        lVar16 = 0;
        local_250 = 0;
        iVar10 = 0;
LAB_007a5d5d:
        uVar8 = total_txns_to_load;
        uVar12 = txns_tried;
        if (txns_tried <= total_txns_to_load && total_txns_to_load - txns_tried != 0)
        goto code_r0x007a5d73;
        p_Var1 = &mapDeltas._M_t._M_impl.super__Rb_tree_header;
        mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        mapDeltas._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        Unserialize<AutoFile,uint256,long,std::less<uint256>,std::allocator<std::pair<uint256_const,long>>>
                  (&file,&mapDeltas);
        p_Var13 = mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (opts->apply_fee_delta_priority == true) {
          for (; (_Rb_tree_header *)p_Var13 != p_Var1;
              p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
            CTxMemPool::PrioritiseTransaction
                      (pool,(uint256 *)(p_Var13 + 1),(CAmount *)(p_Var13 + 2));
          }
        }
        p_Var1 = &unbroadcast_txids._M_t._M_impl.super__Rb_tree_header;
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ = 0;
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_7_ = 0;
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
             SUB81(p_Var1,0);
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_7_ =
             (undefined7)((ulong)p_Var1 >> 8);
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ =
             unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_;
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_right._1_7_ =
             unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_7_;
        Unserialize<AutoFile,uint256,std::less<uint256>,std::allocator<uint256>>
                  (&file,&unbroadcast_txids);
        if (opts->apply_unbroadcast_set == true) {
          unbroadcast = unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_node_count;
          for (p_Var13 = (_Rb_tree_node_base *)
                         CONCAT71(unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_left._1_7_,
                                  unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_left._0_1_); (_Rb_tree_header *)p_Var13 != p_Var1;
              p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
            CTxMemPool::get((CTxMemPool *)&tx,(uint256 *)pool);
            peVar7 = tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            if (peVar7 != (element_type *)0x0) {
              CTxMemPool::AddUnbroadcastTx(pool,(uint256 *)(p_Var13 + 1));
            }
          }
        }
        std::
        _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
        ::~_Rb_tree(&unbroadcast_txids._M_t);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
        ::~_Rb_tree(&mapDeltas._M_t);
LAB_007a6178:
        std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                  (&xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
        if (uVar12 < uVar8) goto LAB_007a6202;
        bVar9 = true;
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
        ;
        source_file_02._M_len = 0x68;
        logging_function_02._M_str = "LoadMempool";
        logging_function_02._M_len = 0xb;
        LogPrintFormatInternal<long,long,long,long,long>
                  (logging_function_02,source_file_02,0x91,ALL,Info,
                   (ConstevalFormatString<5U>)0xcb5f7b,&count,&failed,&expired,&already_there,
                   &unbroadcast);
        goto LAB_007a6204;
      }
      if (uVar12 == 2) {
        Unserialize<AutoFile,std::byte,std::allocator<std::byte>>(&file,&xor_key);
        goto LAB_007a5c98;
      }
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
    }
LAB_007a6202:
    bVar9 = false;
LAB_007a6204:
    AutoFile::~AutoFile(&file);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar9;
code_r0x007a5d73:
  auVar14._8_4_ = (int)(txns_tried >> 0x20);
  auVar14._0_8_ = txns_tried;
  auVar14._12_4_ = 0x45300000;
  auVar15._8_4_ = (int)(total_txns_to_load >> 0x20);
  auVar15._0_8_ = total_txns_to_load;
  auVar15._12_4_ = 0x45300000;
  percentage_done =
       (int)((((auVar14._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)txns_tried) - 4503599627370496.0)) * 100.0) /
            ((auVar15._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)total_txns_to_load) - 4503599627370496.0)));
  if (iVar10 < percentage_done / 10) {
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
    ;
    source_file_00._M_len = 0x68;
    logging_function_00._M_str = "LoadMempool";
    logging_function_00._M_len = 0xb;
    mapDeltas._M_t._M_impl._0_8_ = total_txns_to_load - txns_tried;
    LogPrintFormatInternal<int,unsigned_long,unsigned_long>
              (logging_function_00,source_file_00,0x4f,ALL,Info,(ConstevalFormatString<3U>)0xcb5ee7,
               &percentage_done,&txns_tried,(unsigned_long *)&mapDeltas);
    iVar10 = percentage_done / 10;
  }
  txns_tried = txns_tried + 1;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  mapDeltas._M_t._M_impl._0_8_ = &::TX_WITH_WITNESS;
  mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = &tx;
  ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_>::Unserialize<AutoFile>
            ((ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> *)&mapDeltas
             ,&file);
  accept_time = ser_readdata64<AutoFile>(&file);
  amountdelta = ser_readdata64<AutoFile>(&file);
  if (opts->use_current_time != false) {
    accept_time = (long)tVar11.__d.__r / 1000000000;
  }
  if ((amountdelta != 0) && (opts->apply_fee_delta_priority == true)) {
    CTxMemPool::PrioritiseTransaction
              (pool,&((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->hash).m_wrapped,&amountdelta);
  }
  if (((pool->m_opts).expiry.__r * -1000000000 + (long)tVar11.__d.__r) / 1000000000 <
      (long)accept_time) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock7,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/mempool_persist.cpp"
               ,100,false);
    AcceptToMemoryPool((MempoolAcceptResult *)&mapDeltas,active_chainstate,&tx,accept_time,false,
                       false);
    if (mapDeltas._M_t._M_impl._0_4_ == 0) {
      local_258 = local_258 + 1;
      count = local_258;
    }
    else {
      unbroadcast_txids._M_t._M_impl._0_1_ = 0;
      uVar3 = *(undefined8 *)
               ((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
               ).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar4 = *(undefined8 *)
               (((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar5 = *(undefined8 *)
               (((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar6 = *(undefined8 *)
               (((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_7_ =
           (undefined7)uVar5;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
           (undefined1)((ulong)uVar5 >> 0x38);
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_7_ =
           (undefined7)uVar6;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ =
           (undefined1)((ulong)uVar6 >> 0x38);
      unbroadcast_txids._M_t._M_impl._1_7_ = SUB87(uVar3,0);
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ =
           (undefined1)((ulong)uVar3 >> 0x38);
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_color._1_3_ =
           (undefined3)uVar4;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
           SUB84((ulong)uVar4 >> 0x18,0);
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
           (undefined1)((ulong)uVar4 >> 0x38);
      bVar9 = CTxMemPool::exists(pool,(GenTxid *)&unbroadcast_txids);
      if (bVar9) {
        local_260 = local_260 + 1;
        already_there = local_260;
      }
      else {
        lVar16 = lVar16 + 1;
        failed = lVar16;
      }
    }
    MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&mapDeltas);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  }
  else {
    local_250 = local_250 + 1;
    expired = local_250;
  }
  bVar9 = util::SignalInterrupt::operator_cast_to_bool(active_chainstate->m_chainman->m_interrupt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (bVar9) goto LAB_007a6178;
  goto LAB_007a5d5d;
}

Assistant:

bool LoadMempool(CTxMemPool& pool, const fs::path& load_path, Chainstate& active_chainstate, ImportMempoolOptions&& opts)
{
    if (load_path.empty()) return false;

    AutoFile file{opts.mockable_fopen_function(load_path, "rb")};
    if (file.IsNull()) {
        LogInfo("Failed to open mempool file. Continuing anyway.\n");
        return false;
    }

    int64_t count = 0;
    int64_t expired = 0;
    int64_t failed = 0;
    int64_t already_there = 0;
    int64_t unbroadcast = 0;
    const auto now{NodeClock::now()};

    try {
        uint64_t version;
        file >> version;
        std::vector<std::byte> xor_key;
        if (version == MEMPOOL_DUMP_VERSION_NO_XOR_KEY) {
            // Leave XOR-key empty
        } else if (version == MEMPOOL_DUMP_VERSION) {
            file >> xor_key;
        } else {
            return false;
        }
        file.SetXor(xor_key);
        uint64_t total_txns_to_load;
        file >> total_txns_to_load;
        uint64_t txns_tried = 0;
        LogInfo("Loading %u mempool transactions from file...\n", total_txns_to_load);
        int next_tenth_to_report = 0;
        while (txns_tried < total_txns_to_load) {
            const int percentage_done(100.0 * txns_tried / total_txns_to_load);
            if (next_tenth_to_report < percentage_done / 10) {
                LogInfo("Progress loading mempool transactions from file: %d%% (tried %u, %u remaining)\n",
                        percentage_done, txns_tried, total_txns_to_load - txns_tried);
                next_tenth_to_report = percentage_done / 10;
            }
            ++txns_tried;

            CTransactionRef tx;
            int64_t nTime;
            int64_t nFeeDelta;
            file >> TX_WITH_WITNESS(tx);
            file >> nTime;
            file >> nFeeDelta;

            if (opts.use_current_time) {
                nTime = TicksSinceEpoch<std::chrono::seconds>(now);
            }

            CAmount amountdelta = nFeeDelta;
            if (amountdelta && opts.apply_fee_delta_priority) {
                pool.PrioritiseTransaction(tx->GetHash(), amountdelta);
            }
            if (nTime > TicksSinceEpoch<std::chrono::seconds>(now - pool.m_opts.expiry)) {
                LOCK(cs_main);
                const auto& accepted = AcceptToMemoryPool(active_chainstate, tx, nTime, /*bypass_limits=*/false, /*test_accept=*/false);
                if (accepted.m_result_type == MempoolAcceptResult::ResultType::VALID) {
                    ++count;
                } else {
                    // mempool may contain the transaction already, e.g. from
                    // wallet(s) having loaded it while we were processing
                    // mempool transactions; consider these as valid, instead of
                    // failed, but mark them as 'already there'
                    if (pool.exists(GenTxid::Txid(tx->GetHash()))) {
                        ++already_there;
                    } else {
                        ++failed;
                    }
                }
            } else {
                ++expired;
            }
            if (active_chainstate.m_chainman.m_interrupt)
                return false;
        }
        std::map<uint256, CAmount> mapDeltas;
        file >> mapDeltas;

        if (opts.apply_fee_delta_priority) {
            for (const auto& i : mapDeltas) {
                pool.PrioritiseTransaction(i.first, i.second);
            }
        }

        std::set<uint256> unbroadcast_txids;
        file >> unbroadcast_txids;
        if (opts.apply_unbroadcast_set) {
            unbroadcast = unbroadcast_txids.size();
            for (const auto& txid : unbroadcast_txids) {
                // Ensure transactions were accepted to mempool then add to
                // unbroadcast set.
                if (pool.get(txid) != nullptr) pool.AddUnbroadcastTx(txid);
            }
        }
    } catch (const std::exception& e) {
        LogInfo("Failed to deserialize mempool data on file: %s. Continuing anyway.\n", e.what());
        return false;
    }

    LogInfo("Imported mempool transactions from file: %i succeeded, %i failed, %i expired, %i already there, %i waiting for initial broadcast\n", count, failed, expired, already_there, unbroadcast);
    return true;
}